

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_tracker_connection.hpp
# Opt level: O1

shared_ptr<libtorrent::aux::udp_tracker_connection> __thiscall
libtorrent::aux::udp_tracker_connection::shared_from_this(udp_tracker_connection *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<libtorrent::aux::tracker_connection> sVar2;
  shared_ptr<libtorrent::aux::udp_tracker_connection> sVar3;
  _func_int **local_20;
  element_type *local_18;
  
  sVar2 = tracker_connection::shared_from_this((tracker_connection *)&stack0xffffffffffffffe0);
  _Var1 = sVar2.super___shared_ptr<libtorrent::aux::tracker_connection,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  (this->super_tracker_connection).super_timeout_handler._vptr_timeout_handler = local_20;
  (this->super_tracker_connection).super_timeout_handler.
  super_enable_shared_from_this<libtorrent::aux::timeout_handler>._M_weak_this.
  super___weak_ptr<libtorrent::aux::timeout_handler,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_18;
  if (local_18 != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(local_18->super_enable_shared_from_this<libtorrent::aux::timeout_handler>).
               _M_weak_this.
               super___weak_ptr<libtorrent::aux::timeout_handler,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = *(int *)&(local_18->super_enable_shared_from_this<libtorrent::aux::timeout_handler>).
                      _M_weak_this.
                      super___weak_ptr<libtorrent::aux::timeout_handler,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr + 1;
      UNLOCK();
    }
    else {
      *(int *)&(local_18->super_enable_shared_from_this<libtorrent::aux::timeout_handler>).
               _M_weak_this.
               super___weak_ptr<libtorrent::aux::timeout_handler,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = *(int *)&(local_18->super_enable_shared_from_this<libtorrent::aux::timeout_handler>).
                      _M_weak_this.
                      super___weak_ptr<libtorrent::aux::timeout_handler,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr + 1;
    }
  }
  if (local_18 != (element_type *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_18);
    _Var1._M_pi = extraout_RDX;
  }
  sVar3.super___shared_ptr<libtorrent::aux::udp_tracker_connection,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  sVar3.super___shared_ptr<libtorrent::aux::udp_tracker_connection,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = this;
  return (shared_ptr<libtorrent::aux::udp_tracker_connection>)
         sVar3.
         super___shared_ptr<libtorrent::aux::udp_tracker_connection,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<udp_tracker_connection> shared_from_this()
		{
			return std::static_pointer_cast<udp_tracker_connection>(
				tracker_connection::shared_from_this());
		}